

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::doFLiteral(Forth *this)

{
  Xt XVar1;
  Char CVar2;
  Cell i;
  long lVar3;
  FCell value1;
  double local_20;
  
  requireFStackAvailable(this,1,"(FLIT)");
  XVar1 = this->next_command;
  local_20 = 0.0;
  lVar3 = 0;
  do {
    CVar2 = dataSpaceAt(this,XVar1 + (int)lVar3);
    *(Char *)((long)&local_20 + lVar3) = CVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  ForthStack<double>::push(&this->fStack,local_20);
  this->next_command = this->next_command + 8;
  return;
}

Assistant:

void doFLiteral() {
			REQUIRE_FSTACK_AVAILABLE(1, "(FLIT)");
			fStack.push(getDataFCell(next_command));
			next_command += sizeof(FCell);
		}